

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3FindInIndex(Parse *pParse,Expr *pX,u32 inFlags,int *prRhsHasNull)

{
  char cVar1;
  byte bVar2;
  ushort uVar3;
  u32 uVar4;
  int iVar5;
  Select *pSVar6;
  SrcList *pSVar7;
  Expr *pEVar8;
  Table *pTab;
  sqlite3 *db;
  char cVar9;
  uint uVar10;
  Vdbe *p;
  ulong uVar11;
  ulong uVar12;
  CollSeq *pCVar13;
  CollSeq *pCVar14;
  Vdbe *pVVar15;
  KeyInfo *zP4;
  uint uVar16;
  int iVar17;
  Schema **ppSVar18;
  int iVar19;
  Index *pIdx;
  bool bVar20;
  Walker local_60;
  
  iVar17 = pParse->nTab;
  pParse->nTab = iVar17 + 1;
  p = sqlite3GetVdbe(pParse);
  if ((((((((pX->flags & 0x800) == 0) ||
          (pSVar6 = (pX->x).pSelect, pSVar6 == (Select *)0x0 || pParse->nErr != 0)) ||
         (pSVar6->pPrior != (Select *)0x0)) ||
        (((pSVar6->selFlags & 5) != 0 || (pSVar6->pLimit != (Expr *)0x0)))) ||
       ((pSVar6->pWhere != (Expr *)0x0 ||
        ((pSVar7 = pSVar6->pSrc, pSVar7->nSrc != 1 || (pSVar7->a[0].pSelect != (Select *)0x0))))))
      || (pTab = pSVar7->a[0].pTab, pTab == (Table *)0x0)) ||
     ((((pTab->tabFlags & 0x10) != 0 || (pSVar6->pEList->nExpr != 1)) ||
      (pEVar8 = pSVar6->pEList->a->pExpr, pEVar8->op != 0x9a)))) {
LAB_00152967:
    if (((inFlags & 1) != 0) && ((pX->flags & 0x800) == 0)) {
      pEVar8 = pX->pLeft;
      pX->pLeft = (Expr *)0x0;
      local_60.u.pNC = (NameContext *)0x0;
      local_60.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
      local_60.pParse = (Parse *)0x0;
      local_60.walkerDepth = 0;
      local_60.eCode = '\x01';
      local_60._37_3_ = 0;
      local_60.xExprCallback = exprNodeIsConstant;
      local_60.xSelectCallback = selectNodeIsConstant;
      sqlite3WalkExpr(&local_60,pX);
      pX->pLeft = pEVar8;
      iVar19 = 5;
      if ((local_60.eCode == '\0') || (((pX->x).pList)->nExpr < 3)) goto LAB_001529d6;
    }
    uVar4 = pParse->nQueryLoop;
    if ((inFlags & 4) == 0) {
      iVar19 = 2;
      uVar16 = 0;
      if (prRhsHasNull == (int *)0x0) {
        iVar17 = 0;
      }
      else {
        iVar17 = pParse->nMem + 1;
        pParse->nMem = iVar17;
        *prRhsHasNull = iVar17;
        uVar16 = 0;
      }
    }
    else {
      pParse->nQueryLoop = 0;
      iVar19 = 2;
      iVar17 = 0;
      if (pX->pLeft->iColumn < 0) {
        uVar10 = pX->flags & 0x800;
        uVar16 = uVar10 >> 0xb ^ 1;
        iVar19 = 2 - (uint)(uVar10 == 0);
      }
      else {
        uVar16 = 0;
      }
    }
    sqlite3CodeSubselect(pParse,pX,iVar17,uVar16);
    pParse->nQueryLoop = uVar4;
  }
  else {
    db = pParse->db;
    uVar3 = pEVar8->iColumn;
    if (pTab->pSchema == (Schema *)0x0) {
      uVar12 = 0xfff0bdc0;
    }
    else {
      uVar16 = db->nDb;
      if ((int)uVar16 < 1) {
        uVar12 = 0;
      }
      else {
        ppSVar18 = &db->aDb->pSchema;
        uVar11 = 0;
        do {
          uVar12 = uVar11;
          if (*ppSVar18 == pTab->pSchema) break;
          uVar11 = uVar11 + 1;
          ppSVar18 = ppSVar18 + 4;
          uVar12 = (ulong)uVar16;
        } while (uVar16 != uVar11);
      }
    }
    iVar19 = (int)(short)uVar12;
    sqlite3CodeVerifySchema(pParse,iVar19);
    sqlite3TableLock(pParse,iVar19,pTab->tnum,'\0',pTab->zName);
    if (-1 < (short)uVar3) {
      pCVar13 = sqlite3BinaryCompareCollSeq(pParse,pX->pLeft,pEVar8);
      cVar1 = (&pTab->aCol->affinity)[(uint)uVar3 * 0x30];
      cVar9 = comparisonAffinity(pX);
      if (cVar9 == 'A') {
        bVar20 = true;
      }
      else if (cVar9 == 'B') {
        bVar20 = cVar1 == 'B';
      }
      else {
        bVar20 = 'B' < cVar1;
      }
      pIdx = pTab->pIndex;
      if ((pIdx != (Index *)0x0) && (bVar20)) {
        do {
          if (((*pIdx->aiColumn == uVar3) &&
              (pCVar14 = sqlite3FindCollSeq(db,db->enc,*pIdx->azColl,0), pCVar14 == pCVar13)) &&
             (((inFlags & 4) == 0 || ((pIdx->nKeyCol == 1 && (pIdx->onError != '\0')))))) {
            pVVar15 = sqlite3GetVdbe(pParse);
            iVar5 = pParse->nOnce;
            pParse->nOnce = iVar5 + 1;
            uVar16 = sqlite3VdbeAddOp3(pVVar15,0x2c,iVar5,0,0);
            sqlite3VdbeAddOp3(p,0x36,iVar17,pIdx->tnum,iVar19);
            pVVar15 = pParse->pVdbe;
            zP4 = sqlite3KeyInfoOfIndex(pParse,pIdx);
            sqlite3VdbeChangeP4(pVVar15,-1,(char *)zP4,-6);
            bVar2 = *pIdx->aSortOrder;
            if ((prRhsHasNull != (int *)0x0) && ((&pTab->aCol->notNull)[(uint)uVar3 * 0x30] == '\0')
               ) {
              iVar19 = pParse->nMem + 1;
              pParse->nMem = iVar19;
              *prRhsHasNull = iVar19;
              sqlite3SetHasNullFlag(p,iVar17,iVar19);
            }
            iVar19 = bVar2 + 3;
            uVar10 = p->nOp;
            goto LAB_00152bc7;
          }
          pIdx = pIdx->pNext;
        } while (pIdx != (Index *)0x0);
      }
      goto LAB_00152967;
    }
    pVVar15 = sqlite3GetVdbe(pParse);
    iVar5 = pParse->nOnce;
    pParse->nOnce = iVar5 + 1;
    uVar16 = sqlite3VdbeAddOp3(pVVar15,0x2c,iVar5,0,0);
    sqlite3OpenTable(pParse,iVar17,iVar19,pTab,0x36);
    uVar10 = p->nOp;
    iVar19 = 1;
LAB_00152bc7:
    if (uVar16 < uVar10) {
      p->aOp[uVar16].p2 = uVar10;
    }
    p->pParse->iFixedOp = uVar10 - 1;
LAB_001529d6:
    pX->iTable = iVar17;
  }
  return iVar19;
}

Assistant:

SQLITE_PRIVATE int sqlite3FindInIndex(Parse *pParse, Expr *pX, u32 inFlags, int *prRhsHasNull){
  Select *p;                            /* SELECT to the right of IN operator */
  int eType = 0;                        /* Type of RHS table. IN_INDEX_* */
  int iTab = pParse->nTab++;            /* Cursor of the RHS table */
  int mustBeUnique;                     /* True if RHS must be unique */
  Vdbe *v = sqlite3GetVdbe(pParse);     /* Virtual machine being coded */

  assert( pX->op==TK_IN );
  mustBeUnique = (inFlags & IN_INDEX_LOOP)!=0;

  /* Check to see if an existing table or index can be used to
  ** satisfy the query.  This is preferable to generating a new 
  ** ephemeral table.
  */
  p = (ExprHasProperty(pX, EP_xIsSelect) ? pX->x.pSelect : 0);
  if( ALWAYS(pParse->nErr==0) && isCandidateForInOpt(p) ){
    sqlite3 *db = pParse->db;              /* Database connection */
    Table *pTab;                           /* Table <table>. */
    Expr *pExpr;                           /* Expression <column> */
    i16 iCol;                              /* Index of column <column> */
    i16 iDb;                               /* Database idx for pTab */

    assert( p );                        /* Because of isCandidateForInOpt(p) */
    assert( p->pEList!=0 );             /* Because of isCandidateForInOpt(p) */
    assert( p->pEList->a[0].pExpr!=0 ); /* Because of isCandidateForInOpt(p) */
    assert( p->pSrc!=0 );               /* Because of isCandidateForInOpt(p) */
    pTab = p->pSrc->a[0].pTab;
    pExpr = p->pEList->a[0].pExpr;
    iCol = (i16)pExpr->iColumn;
   
    /* Code an OP_Transaction and OP_TableLock for <table>. */
    iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
    sqlite3CodeVerifySchema(pParse, iDb);
    sqlite3TableLock(pParse, iDb, pTab->tnum, 0, pTab->zName);

    /* This function is only called from two places. In both cases the vdbe
    ** has already been allocated. So assume sqlite3GetVdbe() is always
    ** successful here.
    */
    assert(v);
    if( iCol<0 ){
      int iAddr = sqlite3CodeOnce(pParse);
      VdbeCoverage(v);

      sqlite3OpenTable(pParse, iTab, iDb, pTab, OP_OpenRead);
      eType = IN_INDEX_ROWID;

      sqlite3VdbeJumpHere(v, iAddr);
    }else{
      Index *pIdx;                         /* Iterator variable */

      /* The collation sequence used by the comparison. If an index is to
      ** be used in place of a temp-table, it must be ordered according
      ** to this collation sequence.  */
      CollSeq *pReq = sqlite3BinaryCompareCollSeq(pParse, pX->pLeft, pExpr);

      /* Check that the affinity that will be used to perform the 
      ** comparison is the same as the affinity of the column. If
      ** it is not, it is not possible to use any index.
      */
      int affinity_ok = sqlite3IndexAffinityOk(pX, pTab->aCol[iCol].affinity);

      for(pIdx=pTab->pIndex; pIdx && eType==0 && affinity_ok; pIdx=pIdx->pNext){
        if( (pIdx->aiColumn[0]==iCol)
         && sqlite3FindCollSeq(db, ENC(db), pIdx->azColl[0], 0)==pReq
         && (!mustBeUnique || (pIdx->nKeyCol==1 && IsUniqueIndex(pIdx)))
        ){
          int iAddr = sqlite3CodeOnce(pParse); VdbeCoverage(v);
          sqlite3VdbeAddOp3(v, OP_OpenRead, iTab, pIdx->tnum, iDb);
          sqlite3VdbeSetP4KeyInfo(pParse, pIdx);
          VdbeComment((v, "%s", pIdx->zName));
          assert( IN_INDEX_INDEX_DESC == IN_INDEX_INDEX_ASC+1 );
          eType = IN_INDEX_INDEX_ASC + pIdx->aSortOrder[0];

          if( prRhsHasNull && !pTab->aCol[iCol].notNull ){
            *prRhsHasNull = ++pParse->nMem;
            sqlite3SetHasNullFlag(v, iTab, *prRhsHasNull);
          }
          sqlite3VdbeJumpHere(v, iAddr);
        }
      }
    }
  }

  /* If no preexisting index is available for the IN clause
  ** and IN_INDEX_NOOP is an allowed reply
  ** and the RHS of the IN operator is a list, not a subquery
  ** and the RHS is not contant or has two or fewer terms,
  ** then it is not worth creating an ephemeral table to evaluate
  ** the IN operator so return IN_INDEX_NOOP.
  */
  if( eType==0
   && (inFlags & IN_INDEX_NOOP_OK)
   && !ExprHasProperty(pX, EP_xIsSelect)
   && (!sqlite3InRhsIsConstant(pX) || pX->x.pList->nExpr<=2)
  ){
    eType = IN_INDEX_NOOP;
  }
     

  if( eType==0 ){
    /* Could not find an existing table or index to use as the RHS b-tree.
    ** We will have to generate an ephemeral table to do the job.
    */
    u32 savedNQueryLoop = pParse->nQueryLoop;
    int rMayHaveNull = 0;
    eType = IN_INDEX_EPH;
    if( inFlags & IN_INDEX_LOOP ){
      pParse->nQueryLoop = 0;
      if( pX->pLeft->iColumn<0 && !ExprHasProperty(pX, EP_xIsSelect) ){
        eType = IN_INDEX_ROWID;
      }
    }else if( prRhsHasNull ){
      *prRhsHasNull = rMayHaveNull = ++pParse->nMem;
    }
    sqlite3CodeSubselect(pParse, pX, rMayHaveNull, eType==IN_INDEX_ROWID);
    pParse->nQueryLoop = savedNQueryLoop;
  }else{
    pX->iTable = iTab;
  }
  return eType;
}